

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void parsePrecedence(Precedence precedence)

{
  ParseFn p_Var1;
  
  advance();
  p_Var1 = rules[parser.previous.type].prefix;
  while( true ) {
    if (p_Var1 == (ParseFn)0x0) {
      errorAt(&parser.previous,"Expect expression.");
      return;
    }
    (*p_Var1)(precedence < PREC_OR);
    while (precedence <= rules[parser.current.type].precedence) {
      advance();
      (*rules[parser.previous.type].infix)(precedence < PREC_OR);
    }
    if ((PREC_ASSIGNMENT < precedence) || (parser.current.type != TOKEN_EQUAL)) break;
    advance();
    errorAt(&parser.previous,"Invalid assignment target.");
    advance();
    p_Var1 = rules[parser.previous.type].prefix;
    precedence = PREC_ASSIGNMENT;
  }
  return;
}

Assistant:

static void parsePrecedence(Precedence precedence) {
    advance();
    ParseFn prefixRule = getRule(parser.previous.type)->prefix;
    if (prefixRule == NULL) {
        error("Expect expression.");
        return;
    }

    bool canAssign = precedence <= PREC_ASSIGNMENT;
    prefixRule(canAssign);

    while (precedence <= getRule(parser.current.type)->precedence) {
        advance();
        ParseFn infixRule = getRule(parser.previous.type)->infix;
        infixRule(canAssign);
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        error("Invalid assignment target.");
        expression();
    }
}